

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O0

void parse_partname(string *part_name)

{
  bool bVar1;
  string *in_RDI;
  string frame;
  size_t pos2;
  size_t pos;
  size_t posSlash;
  string *in_stack_ffffffffffffff60;
  string local_80 [32];
  long local_60;
  string local_58 [32];
  long local_38;
  string local_30 [32];
  long local_10;
  string *local_8;
  
  local_8 = in_RDI;
  local_10 = std::__cxx11::string::rfind((char *)in_RDI,0x11c039);
  if (local_10 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_30);
    std::__cxx11::string::~string(local_30);
  }
  local_38 = std::__cxx11::string::rfind((char *)local_8,0x11c03b);
  if (local_38 != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_8);
    std::__cxx11::string::operator=(local_8,local_58);
    std::__cxx11::string::~string(local_58);
    local_60 = std::__cxx11::string::rfind((char *)local_8,0x11c040);
    if (local_60 != -1) {
      std::__cxx11::string::substr((ulong)local_80,(ulong)local_8);
      bVar1 = is_number(in_stack_ffffffffffffff60);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&stack0xffffffffffffff60,(ulong)local_8);
        std::__cxx11::string::operator=(local_8,(string *)&stack0xffffffffffffff60);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
      }
      std::__cxx11::string::~string(local_80);
    }
  }
  return;
}

Assistant:

void
parse_partname (string& part_name)
{
    // strip off a path delimitation
    size_t posSlash = part_name.rfind (IMF_PATH_SEPARATOR);
    if (posSlash != string::npos) part_name = part_name.substr (posSlash + 1);

    // strip the exr ext
    size_t pos = part_name.rfind (".exr");
    if (pos != string::npos)
    {
        part_name = part_name.substr (0, pos);

        // strip off the frame number
        size_t pos2 = part_name.rfind (".");
        if (pos2 != string::npos)
        {
            string frame = part_name.substr (pos2 + 1, pos);
            if (is_number (frame)) part_name = part_name.substr (0, pos2);
        }
    }
}